

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringStream.c
# Opt level: O0

void sysbvm_stringStream_increaseCapacityToAtLeast
               (sysbvm_context_t *context,sysbvm_tuple_t stringStream,size_t requiredCapacity)

{
  sysbvm_size_t __n;
  size_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_object_tuple_t *oldStorage;
  sysbvm_object_tuple_t *newStorage;
  size_t newCapacity;
  size_t oldCapacity;
  size_t size;
  sysbvm_stringStream_t *stringStreamObject;
  size_t requiredCapacity_local;
  sysbvm_tuple_t stringStream_local;
  sysbvm_context_t *context_local;
  
  __n = sysbvm_tuple_size_decode(*(sysbvm_tuple_t *)(stringStream + 0x10));
  sVar1 = sysbvm_tuple_getSizeInBytes(*(sysbvm_tuple_t *)(stringStream + 0x18));
  newStorage = (sysbvm_object_tuple_t *)(sVar1 << 1);
  if (newStorage < (sysbvm_object_tuple_t *)0x10) {
    newStorage = (sysbvm_object_tuple_t *)0x10;
  }
  for (; newStorage < requiredCapacity;
      newStorage = (sysbvm_object_tuple_t *)((long)newStorage << 1)) {
  }
  sVar2 = sysbvm_string_createEmptyWithSize(context,(size_t)newStorage);
  memcpy((void *)(sVar2 + 0x10),(void *)(*(long *)(stringStream + 0x18) + 0x10),__n);
  *(sysbvm_tuple_t *)(stringStream + 0x18) = sVar2;
  return;
}

Assistant:

static void sysbvm_stringStream_increaseCapacityToAtLeast(sysbvm_context_t *context, sysbvm_tuple_t stringStream, size_t requiredCapacity)
{
    sysbvm_stringStream_t *stringStreamObject = (sysbvm_stringStream_t*)stringStream;
    size_t size = sysbvm_tuple_size_decode(stringStreamObject->size);
    size_t oldCapacity = sysbvm_tuple_getSizeInBytes(stringStreamObject->storage);
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 16)
        newCapacity = 16;
    while(newCapacity < requiredCapacity)
        newCapacity *= 2;

    sysbvm_object_tuple_t *newStorage = (sysbvm_object_tuple_t*)sysbvm_string_createEmptyWithSize(context, newCapacity);
    sysbvm_object_tuple_t *oldStorage = (sysbvm_object_tuple_t*)stringStreamObject->storage;
    memcpy(newStorage->bytes, oldStorage->bytes, size);
    stringStreamObject->storage = (sysbvm_tuple_t)newStorage;
}